

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O3

int shared_destroy_entry(int idx)

{
  SHARED_GTAB *pSVar1;
  SHARED_GTAB *pSVar2;
  int iVar3;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  
  iVar3 = 0x97;
  if ((-1 < idx) && (idx < shared_maxseg)) {
    iVar4 = 0;
    iVar3 = 0;
    if (shared_gt[(uint)idx].sem != -1) {
      iVar3 = semctl(shared_gt[(uint)idx].sem,0,0,0,in_R8,in_R9,0x97);
    }
    if (shared_gt[(uint)idx].handle != -1) {
      iVar4 = shmctl(shared_gt[(uint)idx].handle,0,(shmid_ds *)0x0);
    }
    pSVar2 = shared_gt;
    if (iVar3 != 0) {
      iVar4 = iVar3;
    }
    iVar3 = 0x97;
    if (idx < shared_maxseg) {
      pSVar1 = shared_gt + (uint)idx;
      pSVar1->sem = -1;
      pSVar1->semkey = -1;
      pSVar1->key = -1;
      pSVar1->handle = -1;
      pSVar1 = pSVar2 + (uint)idx;
      pSVar1->size = 0;
      pSVar1->nprocdebug = 0;
      pSVar2[(uint)idx].attr = '\0';
      iVar3 = 0;
    }
    if (iVar4 != 0) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

static  int shared_destroy_entry(int idx)       /* unconditionally destroy sema & shseg and clear entry */
 { int r, r2;
   union semun filler;

   if ((idx < 0) || (idx >= shared_maxseg)) return(SHARED_BADARG);
   r2 = r = SHARED_OK;
   filler.val = 0;                              /* this is to make cc happy (warning otherwise) */
   if (SHARED_INVALID != shared_gt[idx].sem)  r = semctl(shared_gt[idx].sem, 0, IPC_RMID, filler); /* destroy semaphore */
   if (SHARED_INVALID != shared_gt[idx].handle) r2 = shmctl(shared_gt[idx].handle, IPC_RMID, 0); /* destroy shared memory segment */
   if (SHARED_OK == r) r = r2;                  /* accumulate error code in r, free r2 */
   r2 = shared_clear_entry(idx);
   return((SHARED_OK == r) ? r2 : r);
 }